

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easygetopt.c
# Opt level: O2

curl_easyoption * curl_easy_option_by_id(CURLoption id)

{
  curl_easyoption *pcVar1;
  
  pcVar1 = lookup((char *)0x0,id);
  return pcVar1;
}

Assistant:

const struct curl_easyoption *curl_easy_option_by_id(CURLoption id)
{
  return lookup(NULL, id);
}